

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_gsub(lua_State *L)

{
  char cVar1;
  StkId pTVar2;
  lua_State *L_00;
  byte bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  lua_Integer lVar9;
  char *e;
  char *pcVar10;
  ushort **ppuVar11;
  TValue *key;
  ulong uVar12;
  TValue *t;
  size_t srcl;
  size_t l;
  MatchState ms;
  luaL_Buffer b;
  ulong uVar13;
  
  pcVar7 = luaL_checklstring(L,1,&srcl);
  pcVar8 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar5 = lua_type(L,3);
  lVar9 = luaL_optinteger(L,4,srcl + 1);
  cVar1 = *pcVar8;
  if (3 < iVar5 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  b.p = b.buffer;
  b.lvl = 0;
  ms.src_end = pcVar7 + srcl;
  iVar5 = 0;
  ms.src_init = pcVar7;
  ms.L = L;
  b.L = L;
  do {
    e = pcVar7;
    if ((int)lVar9 <= iVar5) break;
    ms.level = 0;
    e = match(&ms,pcVar7,pcVar8 + (cVar1 == '^'));
    L_00 = ms.L;
    if (e == (char *)0x0) {
LAB_0011052d:
      e = pcVar7;
      if (ms.src_end <= pcVar7) break;
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
      }
      e = pcVar7 + 1;
      *b.p = *pcVar7;
      b.p = b.p + 1;
    }
    else {
      iVar6 = lua_type(ms.L,3);
      if (iVar6 - 3U < 2) {
        pcVar10 = lua_tolstring(L_00,3,&l);
        uVar12 = 0;
        while (uVar12 < l) {
          cVar4 = pcVar10[uVar12];
          if (cVar4 == '%') {
            uVar13 = uVar12 + 1;
            ppuVar11 = __ctype_b_loc();
            bVar3 = pcVar10[uVar12 + 1];
            if ((*(byte *)((long)*ppuVar11 + (ulong)bVar3 * 2 + 1) & 8) == 0) {
              if (&stack0xffffffffffffffd0 <= b.p) {
                luaL_prepbuffer(&b);
                bVar3 = pcVar10[uVar13];
              }
              *b.p = bVar3;
              b.p = (char *)((byte *)b.p + 1);
            }
            else if (bVar3 == 0x30) {
              luaL_addlstring(&b,pcVar7,(long)e - (long)pcVar7);
            }
            else {
              push_onecapture(&ms,(char)bVar3 + -0x31,pcVar7,e);
              luaL_addvalue(&b);
            }
          }
          else {
            if (&stack0xffffffffffffffd0 <= b.p) {
              luaL_prepbuffer(&b);
              cVar4 = pcVar10[uVar12];
            }
            *b.p = cVar4;
            uVar13 = uVar12;
            b.p = b.p + 1;
          }
          uVar12 = uVar13 + 1;
        }
      }
      else {
        if (iVar6 == 5) {
          push_onecapture(&ms,0,pcVar7,e);
          t = L_00->base + 2;
          if (L_00->top <= t) {
            t = &luaO_nilobject_;
          }
          key = L_00->top + -1;
          luaV_gettable(L_00,t,key,key);
        }
        else if (iVar6 == 6) {
          lua_pushvalue(L_00,3);
          iVar6 = push_captures(&ms,pcVar7,e);
          lua_call(L_00,iVar6,1);
        }
        iVar6 = lua_toboolean(L_00,-1);
        if (iVar6 == 0) {
          L_00->top = L_00->top + -1;
          lua_pushlstring(L_00,pcVar7,(long)e - (long)pcVar7);
        }
        else {
          iVar6 = lua_isstring(L_00,-1);
          if (iVar6 == 0) {
            iVar5 = lua_type(L_00,-1);
            if (iVar5 == -1) {
              pcVar7 = "no value";
            }
            else {
              pcVar7 = luaT_typenames[iVar5];
            }
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar7);
          }
        }
        luaL_addvalue(&b);
      }
      iVar5 = iVar5 + 1;
      if (e <= pcVar7) goto LAB_0011052d;
    }
    pcVar7 = e;
  } while (cVar1 != '^');
  luaL_addlstring(&b,e,(long)ms.src_end - (long)e);
  luaL_pushresult(&b);
  pTVar2 = L->top;
  (pTVar2->value).n = (double)iVar5;
  pTVar2->tt = 3;
  L->top = L->top + 1;
  return 2;
}

Assistant:

static int str_gsub(lua_State*L){
size_t srcl;
const char*src=luaL_checklstring(L,1,&srcl);
const char*p=luaL_checkstring(L,2);
int tr=lua_type(L,3);
int max_s=luaL_optint(L,4,srcl+1);
int anchor=(*p=='^')?(p++,1):0;
int n=0;
MatchState ms;
luaL_Buffer b;
luaL_argcheck(L,tr==3||tr==4||
tr==6||tr==5,3,
"string/function/table expected");
luaL_buffinit(L,&b);
ms.L=L;
ms.src_init=src;
ms.src_end=src+srcl;
while(n<max_s){
const char*e;
ms.level=0;
e=match(&ms,src,p);
if(e){
n++;
add_value(&ms,&b,src,e);
}
if(e&&e>src)
src=e;
else if(src<ms.src_end)
luaL_addchar(&b,*src++);
else break;
if(anchor)break;
}
luaL_addlstring(&b,src,ms.src_end-src);
luaL_pushresult(&b);
lua_pushinteger(L,n);
return 2;
}